

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwGetWindowContentScale(GLFWwindow *handle,float *xscale,float *yscale)

{
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/src/window.c"
                  ,0x2aa,"void glfwGetWindowContentScale(GLFWwindow *, float *, float *)");
  }
  if (xscale != (float *)0x0) {
    *xscale = 0.0;
  }
  if (yscale != (float *)0x0) {
    *yscale = 0.0;
  }
  if (_glfw.initialized != 0) {
    _glfwPlatformGetWindowContentScale((_GLFWwindow *)handle,xscale,yscale);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwGetWindowContentScale(GLFWwindow* handle,
                                       float* xscale, float* yscale)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (xscale)
        *xscale = 0.f;
    if (yscale)
        *yscale = 0.f;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowContentScale(window, xscale, yscale);
}